

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O0

void test_word_container<wchar_t,std::_List_iterator<wchar_t>>
               (_List_iterator<wchar_t> begin,_List_iterator<wchar_t> end,
               vector<int,_std::allocator<int>_> *ipos,vector<int,_std::allocator<int>_> *imasks,
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *ichunks,locale *l,boundary_type bt)

{
  base_iterator end_00;
  base_iterator end_01;
  base_iterator end_02;
  base_iterator end_03;
  base_iterator end_04;
  base_iterator end_05;
  uint uVar1;
  bool bVar2;
  __type _Var3;
  rule_type rVar4;
  ulong uVar5;
  size_type sVar6;
  uint *puVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  ostream *poVar10;
  undefined8 uVar11;
  pointer psVar12;
  rule_type *prVar13;
  reference pvVar14;
  pointer pbVar15;
  reference pvVar16;
  reference pvVar17;
  int iVar18;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  _List_node_base *in_RSI;
  _List_node_base *in_RDI;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_R8;
  int in_stack_00000008;
  iterator p_12;
  uint i_13;
  ti_type ti_5;
  iterator p_11;
  uint i_12;
  ti_type ti_4;
  ti_type ti_2;
  iterator p_10;
  uint i_11;
  ti_type ti_3;
  iterator p_9;
  uint i_10;
  ti_type ti_1;
  bi_type bi_5;
  iterator p_8;
  uint i_9;
  bi_type bi_4;
  iterator p_7;
  uint i_8;
  bi_type bi_3;
  bi_type bi_2;
  iterator p_6;
  uint i_7;
  bi_type bi_1;
  iterator p_5;
  uint i_6;
  bi_type bi;
  ti_type ti;
  _List_iterator<wchar_t> optr_2;
  uint iters_ptr;
  iter_type_conflict p_4;
  uint i_5;
  boundary_point_index<std::_List_iterator<wchar_t>_> map_1;
  _List_iterator<wchar_t> optr_1;
  uint i_4;
  uint chunk_ptr_1;
  iter_type p_3;
  _List_iterator<wchar_t> optr;
  uint i_3;
  uint chunk_ptr;
  iter_type p_2;
  uint index_1;
  iter_type p_1;
  uint i_2;
  uint index;
  iter_type p;
  uint i_1;
  segment_index<std::_List_iterator<wchar_t>_> map;
  _List_iterator<wchar_t> ptr;
  uint i;
  vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_> iters;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  fchunks;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> empty_chunk;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmasks;
  vector<int,_std::allocator<int>_> pos;
  vector<int,_std::allocator<int>_> masks;
  uint mask;
  int sm;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *in_stack_ffffffffffffde98;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *in_stack_ffffffffffffdea0;
  segment_index<std::_List_iterator<wchar_t>_> *in_stack_ffffffffffffdea8;
  string *s;
  base_iterator in_stack_ffffffffffffdeb0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffdeb8;
  segment_index<std::_List_iterator<wchar_t>_> *in_stack_ffffffffffffdec0;
  undefined4 in_stack_ffffffffffffdec8;
  rule_type in_stack_ffffffffffffdecc;
  base_iterator in_stack_ffffffffffffded0;
  segment<std::_List_iterator<wchar_t>_> *in_stack_ffffffffffffded8;
  undefined1 local_16d1 [39];
  undefined1 local_16aa;
  allocator local_16a9;
  string local_16a8 [32];
  wstring local_1688 [204];
  uint local_15bc;
  undefined1 local_158a;
  allocator local_1589;
  string local_1588 [38];
  undefined1 local_1562;
  allocator local_1561;
  string local_1560 [32];
  wstring local_1540 [204];
  uint local_1474;
  _List_node_base *local_1448;
  _List_node_base *local_1440;
  segment_index<std::_List_iterator<wchar_t>_> local_1438;
  undefined1 local_140a;
  allocator local_1409;
  string local_1408 [38];
  undefined1 local_13e2;
  allocator local_13e1;
  string local_13e0 [32];
  wstring local_13c0 [204];
  uint local_12f4;
  segment_index<std::_List_iterator<wchar_t>_> local_12f0;
  undefined1 local_12c2;
  allocator local_12c1;
  string local_12c0 [38];
  undefined1 local_129a;
  allocator local_1299;
  string local_1298 [32];
  wstring local_1278 [204];
  uint local_11ac;
  segment_index<std::_List_iterator<wchar_t>_> local_11a8;
  _List_node_base *local_1180;
  _List_node_base *local_1178;
  undefined1 local_1142;
  allocator local_1141;
  string local_1140 [38];
  undefined1 local_111a;
  allocator local_1119;
  string local_1118 [32];
  _Self local_10f8 [6];
  undefined1 local_10c8 [40];
  undefined1 local_10a0 [44];
  uint local_1074;
  undefined1 local_1042;
  allocator local_1041;
  string local_1040 [38];
  undefined1 local_101a;
  allocator local_1019;
  string local_1018 [32];
  _Self local_ff8 [6];
  undefined1 local_fc8 [40];
  undefined1 local_fa0 [44];
  uint local_f74;
  _List_node_base *local_f48;
  _List_node_base *local_f40;
  boundary_point_index<std::_List_iterator<wchar_t>_> local_f38;
  undefined1 local_f0a;
  allocator local_f09;
  string local_f08 [38];
  undefined1 local_ee2;
  allocator local_ee1;
  string local_ee0 [32];
  _Self local_ec0 [6];
  undefined1 local_e90 [40];
  undefined1 local_e68 [44];
  uint local_e3c;
  boundary_point_index<std::_List_iterator<wchar_t>_> local_e38;
  undefined1 local_e0a;
  allocator local_e09;
  string local_e08 [38];
  undefined1 local_de2;
  allocator local_de1;
  string local_de0 [32];
  _Self local_dc0 [6];
  undefined1 local_d90 [40];
  undefined1 local_d68 [44];
  uint local_d3c;
  boundary_point_index<std::_List_iterator<wchar_t>_> local_d38;
  _List_node_base *local_d10;
  _List_node_base *local_d08;
  segment_index<std::_List_iterator<wchar_t>_> local_d00;
  _List_node_base *local_cd8;
  undefined1 local_cca;
  allocator local_cc9;
  string local_cc8 [32];
  _Self local_ca8;
  _List_node_base *local_ca0;
  undefined1 local_c98 [40];
  _Self local_c70;
  uint local_c68;
  undefined1 local_c62;
  allocator local_c61;
  string local_c60 [78];
  undefined1 local_c12;
  allocator local_c11;
  string local_c10 [32];
  _Self local_bf0;
  undefined1 local_be2;
  allocator local_be1;
  string local_be0 [38];
  undefined1 local_bba;
  allocator local_bb9;
  string local_bb8 [38];
  undefined1 local_b92;
  allocator local_b91;
  string local_b90 [32];
  _Self local_b70 [6];
  undefined1 local_b40 [40];
  undefined1 local_b18 [44];
  uint local_aec;
  _List_node_base *local_ae8;
  _List_node_base *local_ae0;
  boundary_point_index<std::_List_iterator<wchar_t>_> local_ad8;
  _List_node_base *local_ab0;
  undefined1 local_aa2;
  allocator local_aa1;
  string local_aa0 [38];
  undefined1 local_a7a;
  allocator local_a79;
  string local_a78 [32];
  wstring local_a58 [38];
  undefined1 local_a32;
  allocator local_a31;
  string local_a30 [88];
  _List_node_base *local_9d8;
  _Self local_998;
  uint local_990;
  uint local_98c;
  _List_node_base *local_950;
  undefined1 local_942;
  allocator local_941;
  string local_940 [38];
  undefined1 local_91a;
  allocator local_919;
  string local_918 [32];
  wstring local_8f8 [38];
  undefined1 local_8d2;
  allocator local_8d1;
  string local_8d0 [88];
  _List_node_base *local_878;
  _Self local_838;
  uint local_830;
  uint local_82c;
  undefined1 local_7ea;
  allocator local_7e9;
  string local_7e8 [94];
  undefined1 local_78a;
  allocator local_789;
  string local_788 [38];
  undefined1 local_762;
  allocator local_761;
  string local_760 [32];
  wstring local_740 [36];
  uint local_71c;
  undefined1 local_6da;
  allocator local_6d9;
  string local_6d8 [38];
  undefined1 local_6b2;
  allocator local_6b1;
  string local_6b0 [32];
  wstring local_690 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_670;
  wstring local_650 [38];
  undefined1 local_62a;
  allocator local_629;
  string local_628 [94];
  undefined1 local_5ca;
  allocator local_5c9;
  string local_5c8 [38];
  undefined1 local_5a2;
  allocator local_5a1;
  string local_5a0 [38];
  undefined1 local_57a;
  allocator local_579;
  string local_578 [32];
  wstring local_558 [200];
  uint local_490;
  undefined1 local_48a;
  allocator local_489;
  string local_488 [94];
  undefined1 local_42a;
  allocator local_429;
  string local_428 [38];
  undefined1 local_402;
  allocator local_401;
  string local_400 [32];
  wstring local_3e0 [36];
  uint local_3bc;
  undefined1 local_37a;
  allocator local_379;
  string local_378 [38];
  undefined1 local_352;
  allocator local_351;
  string local_350 [32];
  wstring local_330 [38];
  undefined1 local_30a;
  allocator local_309;
  string local_308 [94];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [38];
  undefined1 local_282;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [32];
  wstring local_238 [204];
  uint local_16c;
  _List_node_base *local_168;
  _List_node_base *local_160;
  segment_index<std::_List_iterator<wchar_t>_> local_158;
  value_type local_12c;
  _List_node_base *local_128;
  wstring local_120 [36];
  uint local_fc;
  undefined4 local_f8;
  vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_> local_e8;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_b8;
  wstring local_a0 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  uint local_38;
  uint local_34;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  _Self local_10;
  _List_node_base *local_8;
  
  local_34 = 3;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10._M_node = in_RSI;
  local_8 = in_RDI;
  if (in_stack_00000008 == 1) {
    local_34 = 0x1f;
  }
  do {
    if ((int)local_34 < 0) {
      return;
    }
    local_38 = (local_34 & 1) * 0xf | ((local_34 & 2) >> 1) * 0xf0 | ((local_34 & 4) >> 2) * 0xf00 |
               ((local_34 & 8) >> 3) * 0xf000 | ((local_34 & 0x10) >> 4) * 0xf0000;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x150999);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1509a6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1509b3);
    std::__cxx11::wstring::wstring(local_a0);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x1509cd);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x1509da);
    std::vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>::
    vector((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_> *)
           0x1509ef);
    std::vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>::
    push_back((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
               *)in_stack_ffffffffffffdeb0._M_node,(value_type *)in_stack_ffffffffffffdea8);
    local_f8 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdea0,
               (value_type_conflict2 *)in_stack_ffffffffffffde98);
    for (local_fc = 0; uVar5 = (ulong)local_fc,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(local_20), uVar5 < sVar6;
        local_fc = local_fc + 1) {
      puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_fc);
      if ((*puVar7 & local_38) == 0) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ::operator[](local_28,(ulong)local_fc);
        std::__cxx11::wstring::operator+=(local_a0,(wstring *)pvVar8);
      }
      else {
        std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_fc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdeb0._M_node,
                   (value_type_conflict *)in_stack_ffffffffffffdea8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::operator[](local_28,(ulong)local_fc);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)in_stack_ffffffffffffdeb0._M_node,(value_type *)in_stack_ffffffffffffdea8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::operator[](local_28,(ulong)local_fc);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )CONCAT44(in_stack_ffffffffffffdecc,in_stack_ffffffffffffdec8),
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )in_stack_ffffffffffffdec0);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)in_stack_ffffffffffffdea0,(value_type *)in_stack_ffffffffffffde98);
        std::__cxx11::wstring::~wstring(local_120);
        std::__cxx11::wstring::clear();
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)local_fc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdeb0._M_node,
                   (value_type_conflict *)in_stack_ffffffffffffdea8);
      }
      puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_fc);
      if (((*puVar7 & local_38) != 0) ||
         (uVar5 = (ulong)local_fc, sVar6 = std::vector<int,_std::allocator<int>_>::size(local_20),
         uVar5 == sVar6 - 1)) {
        local_128 = local_8;
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)local_fc);
        std::advance<std::_List_iterator<wchar_t>,int>
                  ((_List_iterator<wchar_t> *)in_stack_ffffffffffffdec0,
                   (int)((ulong)in_stack_ffffffffffffdeb8 >> 0x20));
        std::vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>::
        push_back((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                   *)in_stack_ffffffffffffdeb0._M_node,(value_type *)in_stack_ffffffffffffdea8);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_fc);
        local_12c = *pvVar9;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdea0,
                   (value_type_conflict2 *)in_stack_ffffffffffffde98);
      }
    }
    local_160 = local_8;
    local_168 = local_10._M_node;
    end_00._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_00._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              (in_stack_ffffffffffffdec0,(boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               in_stack_ffffffffffffded0,end_00,(locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::rule
              (&local_158,local_38);
    local_16c = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::full_select
              (&local_158,false);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x150de2);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_16c);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_238);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x67);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_25a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_258,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_25a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x151006);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_16c);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x68);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_282 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_280,"Error limits reached, stopping unit test",&local_281);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_282 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_16c = local_16c + 1;
    }
    test_counter = test_counter + 1;
    sVar6 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size(&local_b8);
    if (sVar6 != local_16c) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x6b);
      poVar10 = std::operator<<(poVar10," chunks.size() == i");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_2aa = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2a8,"Error limits reached, stopping unit test",&local_2a9);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_2aa = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (bVar2) break;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator--((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x1515c0);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      local_16c = local_16c - 1;
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_16c);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_330);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x73);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[--i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_352 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_350,"Error limits reached, stopping unit test",&local_351);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_352 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1517d7);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_16c);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x74);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_37a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_378,"Error limits reached, stopping unit test",&local_379);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_37a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (local_16c != 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x6e);
      poVar10 = std::operator<<(poVar10," i==0");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_30a = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_308,"Error limits reached, stopping unit test",&local_309);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_30a = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_16c = 0;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    for (; uVar5 = (ulong)local_16c,
        sVar6 = std::
                vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ::size(&local_b8), uVar5 < sVar6; local_16c = local_16c + 1) {
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator--((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      sVar6 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size(&local_b8);
      local_3bc = ((int)sVar6 - local_16c) - 1;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x151a5b);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_3bc);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_3e0);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x7a);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[index]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_402 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_400,"Error limits reached, stopping unit test",&local_401);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_402 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x151c66);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_3bc);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x7b);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[index])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_42a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_428,"Error limits reached, stopping unit test",&local_429);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_42a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    bVar2 = booster::
            iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
            ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                          *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    if (!bVar2) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x7d);
      poVar10 = std::operator<<(poVar10," p==map.begin()");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_48a = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_488,"Error limits reached, stopping unit test",&local_489);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_48a = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_490 = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::full_select
              (&local_158,true);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x1520dc);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_d0,(ulong)local_490);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_558);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x85);
        poVar10 = std::operator<<(poVar10," p->str()==fchunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_57a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_578,"Error limits reached, stopping unit test",&local_579);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_57a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1522e7);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_490);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x86);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_5a2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5a0,"Error limits reached, stopping unit test",&local_5a1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_5a2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_490 = local_490 + 1;
    }
    test_counter = test_counter + 1;
    sVar6 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size(&local_b8);
    if (sVar6 != local_490) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x89);
      poVar10 = std::operator<<(poVar10," chunks.size() == i");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_5ca = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5c8,"Error limits reached, stopping unit test",&local_5c9);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_5ca = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (bVar2) break;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator--((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x152891);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_d0,(ulong)(local_490 - 1));
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdea0,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffde98);
      std::__cxx11::wstring::~wstring(local_650);
      if (bVar2) {
        booster::
        iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
        ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                      *)0x15290e);
        booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                  (in_stack_ffffffffffffded8);
        print_str<wchar_t>(&local_670);
        std::__cxx11::wstring::~wstring((wstring *)&local_670);
        pvVar14 = std::
                  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ::operator[](&local_d0,(ulong)(local_490 - 1));
        print_str<wchar_t>(pvVar14);
      }
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x1529b2);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      local_490 = local_490 - 1;
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_d0,(ulong)local_490);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_690);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x96);
        poVar10 = std::operator<<(poVar10," p->str()==fchunks[--i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_6b2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6b0,"Error limits reached, stopping unit test",&local_6b1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_6b2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x152bc9);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_490);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x97);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_6da = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6d8,"Error limits reached, stopping unit test",&local_6d9);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_6da = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (local_490 != 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x8d);
      poVar10 = std::operator<<(poVar10," i==0");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_62a = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_628,"Error limits reached, stopping unit test",&local_629);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_62a = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_490 = 0;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    for (; uVar5 = (ulong)local_490,
        sVar6 = std::
                vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ::size(&local_b8), uVar5 < sVar6; local_490 = local_490 + 1) {
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator--((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      sVar6 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size(&local_b8);
      local_71c = ((int)sVar6 - local_490) - 1;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x152e4d);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_d0,(ulong)local_71c);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_740);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x9e);
        poVar10 = std::operator<<(poVar10," p->str()==fchunks[index]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_762 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_760,"Error limits reached, stopping unit test",&local_761);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_762 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x153058);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_71c);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x9f);
        poVar10 = std::operator<<(poVar10," p->rule() == unsigned(masks[index])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_78a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_788,"Error limits reached, stopping unit test",&local_789);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_78a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    bVar2 = booster::
            iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
            ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                          *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    if (!bVar2) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xa1);
      poVar10 = std::operator<<(poVar10," p==map.begin()");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_7ea = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_7e8,"Error limits reached, stopping unit test",&local_7e9);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_7ea = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    local_82c = 0;
    local_830 = 0;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::full_select
              (&local_158,false);
    local_838._M_node = local_8;
    while (bVar2 = std::operator!=(&local_838,&local_10), bVar2) {
      local_878 = local_838._M_node;
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::find
                (in_stack_ffffffffffffdea8,(base_iterator)in_stack_ffffffffffffdeb0._M_node);
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      uVar5 = (ulong)local_82c;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_68);
      uVar1 = local_830;
      if ((uVar5 < sVar6) &&
         (puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_68,(ulong)local_82c), *puVar7 <= uVar1)) {
        local_82c = local_82c + 1;
      }
      uVar5 = (ulong)local_82c;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_68);
      if (uVar5 < sVar6) {
        test_counter = test_counter + 1;
        booster::
        iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
        ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                      *)0x153753);
        booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                  (in_stack_ffffffffffffded8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::operator[](&local_b8,(ulong)local_82c);
        _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
        std::__cxx11::wstring::~wstring(local_8f8);
        if (!_Var3) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xb2);
          poVar10 = std::operator<<(poVar10," p->str()==chunks[chunk_ptr]");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_91a = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_918,"Error limits reached, stopping unit test",&local_919);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_91a = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        psVar12 = booster::
                  iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                  ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                                *)0x15395e);
        rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
        prVar13 = (rule_type *)
                  std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_82c);
        if (rVar4 != *prVar13) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xb3);
          poVar10 = std::operator<<(poVar10," p->rule()==unsigned(masks[chunk_ptr])");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_942 = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_940,"Error limits reached, stopping unit test",&local_941);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_942 = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      else {
        test_counter = test_counter + 1;
        booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                  ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
        bVar2 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
        if (!bVar2) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xaf);
          poVar10 = std::operator<<(poVar10," p==map.end()");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_8d2 = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_8d0,"Error limits reached, stopping unit test",&local_8d1);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_8d2 = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      local_950 = (_List_node_base *)std::_List_iterator<wchar_t>::operator++(&local_838,0);
      local_830 = local_830 + 1;
    }
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    local_98c = 0;
    local_990 = 0;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::full_select
              (&local_158,true);
    local_998._M_node = local_8;
    while (bVar2 = std::operator!=(&local_998,&local_10), bVar2) {
      local_9d8 = local_998._M_node;
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::find
                (in_stack_ffffffffffffdea8,(base_iterator)in_stack_ffffffffffffdeb0._M_node);
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      uVar5 = (ulong)local_98c;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_68);
      uVar1 = local_990;
      if ((uVar5 < sVar6) &&
         (puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_68,(ulong)local_98c), *puVar7 <= uVar1)) {
        local_98c = local_98c + 1;
      }
      uVar5 = (ulong)local_98c;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_68);
      if (uVar5 < sVar6) {
        test_counter = test_counter + 1;
        booster::
        iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
        ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                      *)0x153e9d);
        booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                  (in_stack_ffffffffffffded8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::operator[](&local_d0,(ulong)local_98c);
        _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
        std::__cxx11::wstring::~wstring(local_a58);
        if (!_Var3) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xc5);
          poVar10 = std::operator<<(poVar10," p->str()==fchunks[chunk_ptr]");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_a7a = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_a78,"Error limits reached, stopping unit test",&local_a79);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_a7a = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        psVar12 = booster::
                  iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                  ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                                *)0x1540a8);
        rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
        prVar13 = (rule_type *)
                  std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_98c);
        if (rVar4 != *prVar13) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xc6);
          poVar10 = std::operator<<(poVar10," p->rule()==unsigned(masks[chunk_ptr])");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_aa2 = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_aa0,"Error limits reached, stopping unit test",&local_aa1);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_aa2 = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      else {
        test_counter = test_counter + 1;
        booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                  ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
        bVar2 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator==((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
        if (!bVar2) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xc2);
          poVar10 = std::operator<<(poVar10," p==map.end()");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          iVar18 = error_counter + 1;
          bVar2 = 100000 < error_counter;
          error_counter = iVar18;
          if (bVar2) {
            local_a32 = 1;
            uVar11 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_a30,"Error limits reached, stopping unit test",&local_a31);
            booster::runtime_error::runtime_error
                      ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                       (string *)in_stack_ffffffffffffdea8);
            local_a32 = 0;
            __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      local_ab0 = (_List_node_base *)std::_List_iterator<wchar_t>::operator++(&local_998,0);
      local_990 = local_990 + 1;
    }
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x1542b0);
    local_ae0 = local_8;
    local_ae8 = local_10._M_node;
    end_01._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_01._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdec0,
               (boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               (base_iterator)in_stack_ffffffffffffded0._M_node,end_01,
               (locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::rule
              (&local_ad8,local_38);
    local_aec = 0;
    booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>
    ::boundary_point_index_iterator
              ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
               in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    memcpy(local_b18,local_b40,0x24);
    while( true ) {
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::end
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1543c1);
      local_b70[0]._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_aec);
      bVar2 = std::operator==(local_b70,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xd6);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_b92 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_b90,"Error limits reached, stopping unit test",&local_b91);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_b92 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1545ec);
      rVar4 = booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::rule
                        (pbVar15);
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_80,(ulong)local_aec);
      if (rVar4 != *pvVar17) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xd7);
        poVar10 = std::operator<<(poVar10," p->rule()==bmasks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_bba = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_bb8,"Error limits reached, stopping unit test",&local_bb9);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_bba = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_aec = local_aec + 1;
    }
    test_counter = test_counter + 1;
    sVar6 = std::
            vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>::
            size(&local_e8);
    if (sVar6 != local_aec) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xda);
      poVar10 = std::operator<<(poVar10," iters.size() == i");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_be2 = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_be0,"Error limits reached, stopping unit test",&local_be1);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_be2 = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    do {
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator--((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_aec = local_aec - 1;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1549ca);
      local_bf0._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::at((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                      *)in_stack_ffffffffffffdea0,(size_type)in_stack_ffffffffffffde98);
      bVar2 = std::operator==(&local_bf0,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xdf);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters.at(i)");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_c12 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_c10,"Error limits reached, stopping unit test",&local_c11);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_c12 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
    } while (bVar2);
    test_counter = test_counter + 1;
    if (local_aec != 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xe1);
      poVar10 = std::operator<<(poVar10," i==0");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      iVar18 = error_counter + 1;
      bVar2 = 100000 < error_counter;
      error_counter = iVar18;
      if (bVar2) {
        local_c62 = 1;
        uVar11 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c60,"Error limits reached, stopping unit test",&local_c61);
        booster::runtime_error::runtime_error
                  ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                   (string *)in_stack_ffffffffffffdea8);
        local_c62 = 0;
        __cxa_throw(uVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_c68 = 0;
    local_c70._M_node = local_8;
    while (bVar2 = std::operator!=(&local_c70,&local_10), bVar2) {
      local_ca0 = local_c70._M_node;
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::find
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea8,
                 in_stack_ffffffffffffdeb0);
      memcpy(local_b18,local_c98,0x24);
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x154e42);
      local_ca8._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_c68);
      bVar2 = std::operator==(&local_ca8,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xe6);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[iters_ptr]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_cca = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_cc8,"Error limits reached, stopping unit test",&local_cc9);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_cca = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::at((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                      *)in_stack_ffffffffffffdea0,(size_type)in_stack_ffffffffffffde98);
      bVar2 = std::operator==(pvVar16,&local_c70);
      if (bVar2) {
        local_c68 = local_c68 + 1;
      }
      local_cd8 = (_List_node_base *)std::_List_iterator<wchar_t>::operator++(&local_c70,0);
    }
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x15509c);
    local_d08 = local_8;
    local_d10 = local_10._M_node;
    end_02._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_02._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              (in_stack_ffffffffffffdec0,(boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               in_stack_ffffffffffffded0,end_02,(locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::rule
              (&local_d00,local_38);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::rule
              (&local_d38,local_38);
    local_d3c = 0;
    booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>
    ::boundary_point_index_iterator
              ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
               in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    memcpy(local_d68,local_d90,0x24);
    while( true ) {
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::end
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1551da);
      local_dc0[0]._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_d3c);
      bVar2 = std::operator==(local_dc0,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xf9);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_de2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_de0,"Error limits reached, stopping unit test",&local_de1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_de2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x15541e);
      rVar4 = booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::rule
                        (pbVar15);
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_80,(ulong)local_d3c);
      if (rVar4 != *pvVar17) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xfa);
        poVar10 = std::operator<<(poVar10," p->rule()==bmasks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_e0a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_e08,"Error limits reached, stopping unit test",&local_e09);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_e0a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_d3c = local_d3c + 1;
    }
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x15561c);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::rule
              (&local_e38,local_38);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::operator=
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_e3c = 0;
    booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>
    ::boundary_point_index_iterator
              ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
               in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    memcpy(local_e68,local_e90,0x24);
    while( true ) {
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::end
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x155705);
      local_ec0[0]._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_e3c);
      bVar2 = std::operator==(local_ec0,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x104);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_ee2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ee0,"Error limits reached, stopping unit test",&local_ee1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_ee2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x155930);
      rVar4 = booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::rule
                        (pbVar15);
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_80,(ulong)local_e3c);
      if (rVar4 != *pvVar17) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x105);
        poVar10 = std::operator<<(poVar10," p->rule()==bmasks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_f0a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_f08,"Error limits reached, stopping unit test",&local_f09);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_f0a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_e3c = local_e3c + 1;
    }
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x155b2e);
    local_f40 = local_8;
    local_f48 = local_10._M_node;
    end_03._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_03._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdec0,
               (boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               (base_iterator)in_stack_ffffffffffffded0._M_node,end_03,
               (locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::rule
              (&local_f38,local_38);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_f74 = 0;
    booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>
    ::boundary_point_index_iterator
              ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
               in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    memcpy(local_fa0,local_fc8,0x24);
    while( true ) {
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::end
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x155c54);
      local_ff8[0]._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_f74);
      bVar2 = std::operator==(local_ff8,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x110);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_101a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1018,"Error limits reached, stopping unit test",&local_1019);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_101a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x155e98);
      rVar4 = booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::rule
                        (pbVar15);
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_80,(ulong)local_f74);
      if (rVar4 != *pvVar17) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x111);
        poVar10 = std::operator<<(poVar10," p->rule()==bmasks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_1042 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1040,"Error limits reached, stopping unit test",&local_1041);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_1042 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_f74 = local_f74 + 1;
    }
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x156096);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::operator=
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_1074 = 0;
    booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>
    ::boundary_point_index_iterator
              ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
               in_stack_ffffffffffffdea0);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::begin
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    memcpy(local_10a0,local_10c8,0x24);
    while( true ) {
      booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::end
                ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,
                           (boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)
                           in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x156167);
      local_10f8[0]._M_node =
           (_List_node_base *)
           booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::iterator
                     (pbVar15);
      pvVar16 = std::
                vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>
                ::operator[](&local_e8,(ulong)local_1074);
      bVar2 = std::operator==(local_10f8,pvVar16);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x11a);
        poVar10 = std::operator<<(poVar10," p->iterator()==iters[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_111a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1118,"Error limits reached, stopping unit test",&local_1119);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_111a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pbVar15 = booster::
                iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x156392);
      rVar4 = booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>::rule
                        (pbVar15);
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_80,(ulong)local_1074);
      if (rVar4 != *pvVar17) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x11b);
        poVar10 = std::operator<<(poVar10," p->rule()==bmasks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_1142 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1140,"Error limits reached, stopping unit test",&local_1141);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_1142 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::boundary_point<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_1074 = local_1074 + 1;
    }
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x156590);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x15659d);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x1565aa);
    local_1178 = local_8;
    local_1180 = local_10._M_node;
    end_04._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_04._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    boundary_point_index
              ((boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdec0,
               (boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               (base_iterator)in_stack_ffffffffffffded0._M_node,end_04,
               (locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::rule
              (&local_11a8,local_38);
    local_11ac = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x1566cd);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_11ac);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_1278);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x127);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_129a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1298,"Error limits reached, stopping unit test",&local_1299);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_129a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x156936);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_11ac);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x128);
        poVar10 = std::operator<<(poVar10," p->rule()==unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_12c2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_12c0,"Error limits reached, stopping unit test",&local_12c1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_12c2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_11ac = local_11ac + 1;
    }
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x156b34);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::rule
              (&local_12f0,local_38);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::operator=
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (boundary_point_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_12f4 = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x156c18);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_12f4);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_13c0);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x132);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_13e2 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_13e0,"Error limits reached, stopping unit test",&local_13e1);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_13e2 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x156e4e);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_12f4);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x133);
        poVar10 = std::operator<<(poVar10," p->rule()==unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_140a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1408,"Error limits reached, stopping unit test",&local_1409);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_140a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_12f4 = local_12f4 + 1;
    }
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x15704c);
    local_1440 = local_8;
    local_1448 = local_10._M_node;
    end_05._M_node._4_4_ = in_stack_ffffffffffffdecc;
    end_05._M_node._0_4_ = in_stack_ffffffffffffdec8;
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              (in_stack_ffffffffffffdec0,(boundary_type)((ulong)in_stack_ffffffffffffdeb8 >> 0x20),
               in_stack_ffffffffffffded0,end_05,(locale *)in_stack_ffffffffffffdeb0._M_node);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::rule
              (&local_1438,local_38);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_1474 = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x15716d);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_1474);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_1540);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x13d);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_1562 = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1560,"Error limits reached, stopping unit test",&local_1561);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_1562 = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      psVar12 = booster::
                iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                              *)0x1573bc);
      rVar4 = booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule(psVar12);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_1474);
      if (rVar4 != *prVar13) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x13e);
        poVar10 = std::operator<<(poVar10," p->rule()==unsigned(masks[i])");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_158a = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1588,"Error limits reached, stopping unit test",&local_1589);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_158a = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_1474 = local_1474 + 1;
    }
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x1575ba);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::operator=
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0,
               (segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffde98);
    local_15bc = 0;
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    segment_index_iterator(in_stack_ffffffffffffdea0);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::begin
              ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    operator=(in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
    while( true ) {
      booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::end
                ((segment_index<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffdea0);
      bVar2 = booster::
              iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
              ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                            *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
      if (!bVar2) break;
      test_counter = test_counter + 1;
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)0x157680);
      booster::locale::boundary::segment<std::_List_iterator<wchar_t>>::str_abi_cxx11_
                (in_stack_ffffffffffffded8);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator[](&local_b8,(ulong)local_15bc);
      _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::wstring::~wstring(local_1688);
      if (!_Var3) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x147);
        poVar10 = std::operator<<(poVar10," p->str()==chunks[i]");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          local_16aa = 1;
          uVar11 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_16a8,"Error limits reached, stopping unit test",&local_16a9);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,
                     (string *)in_stack_ffffffffffffdea8);
          local_16aa = 0;
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      in_stack_ffffffffffffded0._M_node =
           (_List_node_base *)
           booster::
           iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
           ::operator->((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                         *)0x157886);
      in_stack_ffffffffffffdecc =
           booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>::rule
                     ((segment<std::_List_iterator<wchar_t>_> *)in_stack_ffffffffffffded0._M_node);
      prVar13 = (rule_type *)
                std::vector<int,_std::allocator<int>_>::operator[](&local_50,(ulong)local_15bc);
      if (in_stack_ffffffffffffdecc != *prVar13) {
        in_stack_ffffffffffffdec0 =
             (segment_index<std::_List_iterator<wchar_t>_> *)
             std::operator<<((ostream *)&std::cerr,"Error in line:");
        in_stack_ffffffffffffdeb8 =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             std::ostream::operator<<(in_stack_ffffffffffffdec0,0x148);
        in_stack_ffffffffffffdeb0._M_node =
             (_List_node_base *)
             std::operator<<((ostream *)in_stack_ffffffffffffdeb8," p->rule()==unsigned(masks[i])");
        std::ostream::operator<<
                  (in_stack_ffffffffffffdeb0._M_node,std::endl<char,std::char_traits<char>>);
        iVar18 = error_counter + 1;
        bVar2 = 100000 < error_counter;
        error_counter = iVar18;
        if (bVar2) {
          uVar11 = __cxa_allocate_exception(0x30);
          s = (string *)local_16d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_16d1 + 1),"Error limits reached, stopping unit test",
                     (allocator *)s);
          booster::runtime_error::runtime_error
                    ((runtime_error *)in_stack_ffffffffffffdeb0._M_node,s);
          __cxa_throw(uVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::
      iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
      ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>,_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<std::_List_iterator<wchar_t>_>_&,_long>
                    *)in_stack_ffffffffffffdea0);
      local_15bc = local_15bc + 1;
    }
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x157a54);
    booster::locale::boundary::segment_index<std::_List_iterator<wchar_t>_>::~segment_index
              ((segment_index<std::_List_iterator<wchar_t>_> *)0x157a61);
    booster::locale::boundary::boundary_point_index<std::_List_iterator<wchar_t>_>::
    ~boundary_point_index((boundary_point_index<std::_List_iterator<wchar_t>_> *)0x157a6e);
    std::vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_>::
    ~vector((vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_> *)
            in_stack_ffffffffffffdeb0._M_node);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)in_stack_ffffffffffffdeb0._M_node);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)in_stack_ffffffffffffdeb0._M_node);
    std::__cxx11::wstring::~wstring(local_a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_ffffffffffffdeb0._M_node);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdeb0._M_node);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdeb0._M_node);
    local_34 = local_34 - 1;
  } while( true );
}

Assistant:

void test_word_container(Iterator begin,Iterator end,
    std::vector<int> const &ipos,
    std::vector<int> const &imasks,
    std::vector<std::basic_string<Char> > const &ichunks,
    std::locale l,
    lb::boundary_type bt=lb::word
    )
{
    for(int sm=(bt == lb::word ? 31 : 3 ) ;sm>=0;sm--) {
        unsigned mask = 
              ((sm & 1 ) != 0) * 0xF
            + ((sm & 2 ) != 0) * 0xF0
            + ((sm & 4 ) != 0) * 0xF00
            + ((sm & 8 ) != 0) * 0xF000
            + ((sm & 16) != 0) * 0xF0000;

        std::vector<int> masks,pos;
        std::vector<unsigned> bmasks;
        std::basic_string<Char> empty_chunk;

        std::vector<std::basic_string<Char> > chunks;
        std::vector<std::basic_string<Char> > fchunks;
        std::vector<Iterator> iters;
        iters.push_back(begin);
        bmasks.push_back(0);

        for(unsigned i=0;i<imasks.size();i++) {
            if(imasks[i] & mask) {
                masks.push_back(imasks[i]);
                chunks.push_back(ichunks[i]);
                fchunks.push_back(empty_chunk + ichunks[i]);
                empty_chunk.clear();
                pos.push_back(ipos[i]);
            }
            else {
                empty_chunk+=ichunks[i];
            }

            if((imasks[i] & mask) || i==imasks.size()-1){
                Iterator ptr=begin;
                std::advance(ptr,ipos[i]);
                iters.push_back(ptr);
                bmasks.push_back(imasks[i]);
            }
        }

        //
        // segment iterator tests
        //
        {
            lb::segment_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::segment_index<Iterator>::iterator iter_type;

            map.rule(mask);

            {        
                unsigned i=0;
                iter_type p;
                map.full_select(false);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==chunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }
                
                TEST(chunks.size() == i);
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        TEST(p->str()==chunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==chunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }

            {
                unsigned i=0;
                iter_type p;
                map.full_select(true);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==fchunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }

                TEST(chunks.size() == i);
                
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        if(p->str()!=fchunks[i-1]) {
                            print_str(p->str());
                            print_str(fchunks[i-1]);
                        }
                        TEST(p->str()==fchunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==fchunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }
            
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(false);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==chunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(true);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==fchunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }

        } // segment iterator tests

        { // break iterator tests
            lb::boundary_point_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::boundary_point_index<Iterator>::iterator iter_type;

            map.rule(mask);
        
            unsigned i=0;
            iter_type p;
            for(p=map.begin();p!=map.end();++p,i++) {
                TEST(p->iterator()==iters[i]);
                TEST(p->rule()==bmasks[i]);
            }

            TEST(iters.size() == i);

            do {
                --p;
                --i;
                TEST(p->iterator()==iters.at(i));
            } while(p!=map.begin());
            TEST(i==0);

            unsigned iters_ptr=0;
            for(Iterator optr=begin;optr!=end;optr++) {
                p=map.find(optr);
                TEST(p->iterator()==iters[iters_ptr]);
                if(iters.at(iters_ptr)==optr)
                    iters_ptr++;
            }
        
        } // break iterator tests

        { // copy test
            typedef lb::segment_index<Iterator> ti_type;
            typedef lb::boundary_point_index<Iterator> bi_type;
            {   // segment to bound
                ti_type ti(bt,begin,end,l);
                ti.rule(mask);
                {
                    bi_type bi(ti);
                    bi.rule(mask);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi.rule(mask);
                    bi = ti;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                // boundary_point to bound
                bi_type bi_2(bt,begin,end,l);
                bi_2.rule(mask);
                {
                    bi_type bi(bi_2);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi = bi_2;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
            }
            {   // boundary_point to segment
                bi_type bi(bt,begin,end,l);
                {
                    ti_type ti(bi);
                    ti.rule(mask);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti.rule(mask);
                    ti = (bi);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                ti_type ti_2(bt,begin,end,l);
                ti_2.rule(mask);
                {
                    ti_type ti(ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti = (ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
            }
        }
    } // for mask

}